

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.h
# Opt level: O0

iter_type __thiscall
booster::locale::util::base_num_format<wchar_t>::format_time
          (base_num_format<wchar_t> *this,iter_type out,ios_base *ios,char_type_conflict fill,
          time_t time,string_type *format)

{
  ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> __result;
  fmtflags __a;
  _Ios_Fmtflags _Var1;
  ulong uVar2;
  time_put *ptVar3;
  ios_base *this_00;
  long lVar4;
  long lVar5;
  size_t sVar6;
  streamsize sVar7;
  ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> *poVar8;
  ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> *this_01;
  ios_base *in_RCX;
  undefined1 in_DL;
  undefined1 extraout_DL;
  undefined8 extraout_RDX;
  streambuf_type *in_RSI;
  wchar_t in_R8D;
  long in_R9;
  iter_type iVar9;
  fmtflags flags;
  streamsize n;
  streamsize points;
  streamsize on_right;
  streamsize on_left;
  string_type str;
  basic_ostringstream<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> tmp_out;
  int gmtoff;
  vector<char,_std::allocator<char>_> tmp_buf;
  tm tm;
  string tz;
  ios_info *in_stack_fffffffffffffc48;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffc50;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *s;
  undefined4 in_stack_fffffffffffffc58;
  wchar_t in_stack_fffffffffffffc5c;
  wchar_t wVar10;
  ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> *in_stack_fffffffffffffc60;
  undefined4 in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc7c;
  char *in_stack_fffffffffffffc80;
  char *in_stack_fffffffffffffc88;
  streambuf_type *psVar11;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffc90;
  size_t sVar12;
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  __last;
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  __first;
  undefined4 in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcac;
  locale local_2b0;
  size_t local_2a8;
  long local_2a0;
  long local_298;
  ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> local_290 [2];
  undefined8 local_270;
  undefined1 local_268;
  undefined8 local_260;
  undefined4 local_258;
  locale local_250;
  long local_248 [47];
  int local_d0;
  allocator<char> local_b9 [25];
  tm local_a0;
  string local_68 [32];
  long local_48;
  wchar_t local_3c;
  ios_base *local_38;
  ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> local_28;
  streambuf_type *local_18;
  undefined1 uStack_10;
  
  local_48 = in_R9;
  local_3c = in_R8D;
  local_38 = in_RCX;
  local_28._M_sbuf = in_RSI;
  local_28._M_failed = (bool)in_DL;
  ios_info::get((ios_base *)0x28ff0d);
  ios_info::time_zone_abi_cxx11_(in_stack_fffffffffffffc48);
  std::__cxx11::string::c_str();
  std::__cxx11::string::c_str();
  std::__cxx11::string::size();
  std::allocator<char>::allocator();
  std::vector<char,std::allocator<char>>::vector<char_const*,void>
            (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
  std::allocator<char>::~allocator(local_b9);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    local_d0 = parse_tz((string *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
    local_48 = local_d0 + local_48;
    gmtime_r(&local_48,&local_a0);
    if (local_d0 != 0) {
      local_a0.tm_zone = std::vector<char,_std::allocator<char>_>::front(in_stack_fffffffffffffc50);
      local_a0.tm_gmtoff = (long)local_d0;
    }
  }
  else {
    localtime_r(&local_48,&local_a0);
  }
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_248);
  std::ios_base::getloc((ios_base *)in_stack_fffffffffffffc48);
  ptVar3 = std::
           use_facet<std::time_put<wchar_t,std::ostreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>>
                     (&local_250);
  std::ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>::ostreambuf_iterator
            (in_stack_fffffffffffffc60,
             (ostream_type *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
  __first._M_current = (wchar_t *)((long)local_248 + *(long *)(local_248[0] + -0x18));
  wVar10 = local_3c;
  this_00 = (ios_base *)std::__cxx11::wstring::c_str();
  lVar4 = std::__cxx11::wstring::c_str();
  lVar5 = std::__cxx11::wstring::size();
  s = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
      (lVar4 + lVar5 * 4);
  __last._M_current = (wchar_t *)this_00;
  local_270 = std::time_put<wchar_t,std::ostreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>::
              put(ptVar3,local_260,local_258,__first._M_current,wVar10,&local_a0);
  local_268 = extraout_DL;
  std::locale::~locale(&local_250);
  std::__cxx11::wostringstream::str();
  local_298 = 0;
  local_2a0 = 0;
  psVar11 = (streambuf_type *)&local_2b0;
  std::ios_base::getloc(this_00);
  sVar6 = formatting_size_traits<wchar_t>::size(s,(locale *)this_00);
  std::locale::~locale(&local_2b0);
  sVar12 = sVar6;
  local_2a8 = sVar6;
  sVar7 = std::ios_base::width(local_38);
  if ((long)sVar6 < sVar7) {
    sVar7 = std::ios_base::width(local_38);
    lVar4 = sVar7 - local_2a8;
    __a = std::ios_base::flags(local_38);
    _Var1 = std::operator&(__a,_S_adjustfield);
    if (_Var1 != _S_left) {
      local_298 = lVar4;
    }
    local_2a0 = lVar4 - local_298;
  }
  for (; 0 < local_298; local_298 = local_298 + -1) {
    poVar8 = std::ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>::operator++(&local_28,0);
    std::ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>::operator*(poVar8);
    std::ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>::operator=
              (in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c);
  }
  poVar8 = local_290;
  std::__cxx11::wstring::begin();
  std::__cxx11::wstring::end();
  __result._8_8_ = sVar12;
  __result._M_sbuf = psVar11;
  std::
  copy<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>,std::ostreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>
            (__first,__last,__result);
  for (; 0 < local_2a0; local_2a0 = local_2a0 + -1) {
    wVar10 = local_3c;
    this_01 = std::ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>::operator++(&local_28,0)
    ;
    std::ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>::operator*(this_01);
    std::ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>::operator=(poVar8,wVar10);
  }
  std::ios_base::width(local_38,0);
  uStack_10 = local_28._M_failed;
  local_18 = local_28._M_sbuf;
  std::__cxx11::wstring::~wstring((wstring *)local_290);
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_248);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)poVar8);
  std::__cxx11::string::~string(local_68);
  iVar9._9_7_ = (undefined7)((ulong)extraout_RDX >> 8);
  iVar9._M_failed = (bool)uStack_10;
  iVar9._M_sbuf = local_18;
  return iVar9;
}

Assistant:

iter_type format_time(iter_type out,std::ios_base &ios,char_type fill,std::time_t time,string_type const &format) const
    {
        std::string tz = ios_info::get(ios).time_zone();
        std::tm tm;
        #if defined(__linux) || defined(__FreeBSD__) || defined(__APPLE__) 
        std::vector<char> tmp_buf(tz.c_str(),tz.c_str()+tz.size()+1);
        #endif
        if(tz.empty()) {
            #ifdef BOOSTER_WIN_NATIVE
            /// Windows uses TLS
            tm = *localtime(&time);
            #else
            localtime_r(&time,&tm);
            #endif
        }
        else  {
            int gmtoff = parse_tz(tz);
            time+=gmtoff;
            #ifdef BOOSTER_WIN_NATIVE
            /// Windows uses TLS
            tm = *gmtime(&time);
            #else
            gmtime_r(&time,&tm);
            #endif
            
            #if defined(__linux) || defined(__FreeBSD__) || defined(__APPLE__) 
            // These have extra fields to specify timezone
            if(gmtoff!=0) {
                // bsd and apple want tm_zone be non-const
                tm.tm_zone=&tmp_buf.front();
                tm.tm_gmtoff = gmtoff;
            }
            #endif
        }
        std::basic_ostringstream<char_type> tmp_out;
        std::use_facet<std::time_put<char_type> >(ios.getloc()).put(tmp_out,tmp_out,fill,&tm,format.c_str(),format.c_str()+format.size());
        string_type str = tmp_out.str();
        std::streamsize on_left=0,on_right = 0;
        std::streamsize points = 
            formatting_size_traits<char_type>::size(str,ios.getloc());
        if(points < ios.width()) {
            std::streamsize n = ios.width() - points;
            
            std::ios_base::fmtflags flags = ios.flags() & std::ios_base::adjustfield;
            
            //
            // we do not really know internal point, so we assume that it does not
            // exist. so according to the standard field should be right aligned
            //
            if(flags != std::ios_base::left)
                on_left = n;
            on_right = n - on_left;
        }
        while(on_left > 0) {
            *out++ = fill;
            on_left--;
        }
        std::copy(str.begin(),str.end(),out);
        while(on_right > 0) {
            *out++ = fill;
            on_right--;
        }
        ios.width(0);
        return out;
    }